

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::ParseLight
               (Light *light,string *err,json *o,bool store_original_json_for_extras_and_extensions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  reference pbVar5;
  string *psVar6;
  undefined7 in_register_00000009;
  string *property;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *pjVar7;
  json *extraout_RDX_02;
  json *extraout_RDX_03;
  json *extraout_RDX_04;
  undefined1 required;
  stringstream ss;
  json_const_iterator spotIt;
  string local_210;
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [112];
  ios_base local_168 [272];
  json_const_iterator local_58;
  
  local_1ec = (undefined4)
              CONCAT71(in_register_00000009,store_original_json_for_extras_and_extensions);
  local_1e8._0_8_ = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"type","");
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  bVar3 = ParseStringProperty(&light->type,err,o,(string *)local_1e8,true,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if ((ostream *)local_1e8._0_8_ != (ostream *)local_1d8) {
    operator_delete((void *)local_1e8._0_8_);
  }
  if (bVar3) {
    iVar4 = std::__cxx11::string::compare((char *)&light->type);
    if (iVar4 != 0) {
LAB_0011bba5:
      local_1e8._0_8_ = (json *)local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"name","");
      psVar6 = &local_210;
      paVar1 = &local_210.field_2;
      local_210._M_string_length = 0;
      local_210.field_2._M_local_buf[0] = '\0';
      property = (string *)local_1e8;
      required = 0;
      local_210._M_dataplus._M_p = (pointer)paVar1;
      ParseStringProperty(&light->name,err,o,property,false,psVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((json *)local_1e8._0_8_ != (json *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = (json *)local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"color","");
      local_210._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseNumberArrayProperty
                (&light->color,(string *)o,(json *)local_1e8._0_8_,property,(bool)required,psVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((json *)local_1e8._0_8_ != (json *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = (json *)local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"range","");
      local_210._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseNumberProperty(&light->range,err,o,(string *)local_1e8,false,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((json *)local_1e8._0_8_ != (json *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_);
      }
      local_1e8._0_8_ = (json *)local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"intensity","");
      local_210._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"");
      ParseNumberProperty(&light->intensity,err,o,(string *)local_1e8,false,&local_210);
      pjVar7 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p);
        pjVar7 = extraout_RDX_00;
      }
      if ((json *)local_1e8._0_8_ != (json *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_);
        pjVar7 = extraout_RDX_01;
      }
      ParseExtensionsProperty(&light->extensions,(string *)o,pjVar7);
      ParseExtrasProperty(&light->extras,o);
      if ((char)local_1ec != '\0') {
        local_1e8._0_8_ = (pointer)0x0;
        local_1e8._8_8_ = (_Base_ptr)0x0;
        local_1d8._0_6_ = 0;
        local_1d8._6_2_ = 0;
        local_1d8._8_6_ = 0;
        local_1d8[0xe] = '\0';
        local_1d8[0xf] = -0x80;
        bVar3 = detail::FindMember(o,"extensions",(json_const_iterator *)local_1e8);
        if (bVar3) {
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_1e8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::dump(&local_210,pbVar5,-1,' ',false,strict);
          std::__cxx11::string::operator=
                    ((string *)&light->extensions_json_string,(string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar1) {
            operator_delete(local_210._M_dataplus._M_p);
          }
        }
        local_1e8._0_8_ = (pointer)0x0;
        local_1e8._8_8_ = (_Base_ptr)0x0;
        local_1d8._0_6_ = 0;
        local_1d8._6_2_ = 0;
        local_1d8._8_6_ = 0;
        local_1d8[0xe] = '\0';
        local_1d8[0xf] = -0x80;
        bVar3 = detail::FindMember(o,"extras",(json_const_iterator *)local_1e8);
        if (bVar3) {
          pbVar5 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                *)local_1e8);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::dump(&local_210,pbVar5,-1,' ',false,strict);
          std::__cxx11::string::operator=((string *)&light->extras_json_string,(string *)&local_210)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != paVar1) {
            operator_delete(local_210._M_dataplus._M_p);
            return true;
          }
          return true;
        }
        return true;
      }
      return true;
    }
    local_58.m_object = (pointer)0x0;
    local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_58.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
    bVar3 = detail::FindMember(o,"spot",&local_58);
    cVar2 = (char)(ostream *)local_1d8;
    if (bVar3) {
      psVar6 = (string *)
               nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_58);
      if (*(char *)&(psVar6->_M_dataplus)._M_p == '\x01') {
        local_1d8._0_6_ = 0x4372656e6e69;
        local_1d8._6_2_ = 0x6e6f;
        local_1d8._8_6_ = 0x656c676e4165;
        local_1e8._8_8_ = (_Base_ptr)0xe;
        local_1d8[0xe] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        local_1e8._0_8_ = (ostream *)local_1d8;
        ParseNumberProperty(&(light->spot).innerConeAngle,err,(json *)psVar6,(string *)local_1e8,
                            false,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
        if ((ostream *)local_1e8._0_8_ != (ostream *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_);
        }
        local_1d8._0_6_ = 0x43726574756f;
        local_1d8._6_2_ = 0x6e6f;
        local_1d8._8_6_ = 0x656c676e4165;
        local_1e8._8_8_ = (_Base_ptr)0xe;
        local_1d8[0xe] = '\0';
        local_210._M_string_length = 0;
        local_210.field_2._M_local_buf[0] = '\0';
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        local_1e8._0_8_ = (ostream *)local_1d8;
        ParseNumberProperty(&(light->spot).outerConeAngle,err,(json *)psVar6,(string *)local_1e8,
                            false,&local_210);
        pjVar7 = extraout_RDX_02;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
          pjVar7 = extraout_RDX_03;
        }
        if ((ostream *)local_1e8._0_8_ != (ostream *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_);
          pjVar7 = extraout_RDX_04;
        }
        ParseExtensionsProperty(&(light->spot).extensions,psVar6,pjVar7);
        ParseExtrasProperty(&(light->spot).extras,(json *)psVar6);
        if ((char)local_1ec != '\0') {
          local_1e8._0_8_ = (pointer)0x0;
          local_1e8._8_8_ = (_Base_ptr)0x0;
          local_1d8._0_6_ = 0;
          local_1d8._6_2_ = 0;
          local_1d8._8_6_ = 0;
          local_1d8[0xe] = '\0';
          local_1d8[0xf] = -0x80;
          bVar3 = detail::FindMember((json *)psVar6,"extensions",(json_const_iterator *)local_1e8);
          if (bVar3) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_1e8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_210,pbVar5,-1,' ',false,strict);
            std::__cxx11::string::operator=
                      ((string *)&(light->spot).extensions_json_string,(string *)&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
          }
          local_1e8._0_8_ = (pointer)0x0;
          local_1e8._8_8_ = (_Base_ptr)0x0;
          local_1d8._0_6_ = 0;
          local_1d8._6_2_ = 0;
          local_1d8._8_6_ = 0;
          local_1d8[0xe] = '\0';
          local_1d8[0xf] = -0x80;
          bVar3 = detail::FindMember((json *)psVar6,"extras",(json_const_iterator *)local_1e8);
          if (bVar3) {
            pbVar5 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_1e8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_210,pbVar5,-1,' ',false,strict);
            std::__cxx11::string::operator=
                      ((string *)&(light->spot).extras_json_string,(string *)&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p);
            }
          }
        }
        goto LAB_0011bba5;
      }
      if (err == (string *)0x0) {
        return false;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"\"spot\" is not a JSON object.",0x1c);
      std::ios::widen((char)*(undefined8 *)(CONCAT26(local_1d8._6_2_,local_1d8._0_6_) + -0x18) +
                      cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
    }
    else {
      if (err == (string *)0x0) {
        return false;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1d8,"Spot light description not found.",0x21);
      std::ios::widen((char)*(undefined8 *)(CONCAT26(local_1d8._6_2_,local_1d8._0_6_) + -0x18) +
                      cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)err,(ulong)local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
    std::ios_base::~ios_base(local_168);
  }
  return false;
}

Assistant:

static bool ParseLight(Light *light, std::string *err, const detail::json &o,
                       bool store_original_json_for_extras_and_extensions) {
  if (!ParseStringProperty(&light->type, err, o, "type", true)) {
    return false;
  }

  if (light->type == "spot") {
    detail::json_const_iterator spotIt;
    if (!detail::FindMember(o, "spot", spotIt)) {
      if (err) {
        std::stringstream ss;
        ss << "Spot light description not found." << std::endl;
        (*err) += ss.str();
      }
      return false;
    }

    const detail::json &v = detail::GetValue(spotIt);
    if (!detail::IsObject(v)) {
      if (err) {
        std::stringstream ss;
        ss << "\"spot\" is not a JSON object." << std::endl;
        (*err) += ss.str();
      }
      return false;
    }

    if (!ParseSpotLight(&light->spot, err, v,
                        store_original_json_for_extras_and_extensions)) {
      return false;
    }
  }

  ParseStringProperty(&light->name, err, o, "name", false);
  ParseNumberArrayProperty(&light->color, err, o, "color", false);
  ParseNumberProperty(&light->range, err, o, "range", false);
  ParseNumberProperty(&light->intensity, err, o, "intensity", false);

  ParseExtrasAndExtensions(light, err, o,
                           store_original_json_for_extras_and_extensions);

  return true;
}